

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

istream * operator>>(istream *in,Point *p)

{
  istream *this;
  ulong uVar1;
  Point local_20;
  Point *local_18;
  Point *p_local;
  istream *in_local;
  
  local_18 = p;
  p_local = (Point *)in;
  this = (istream *)std::istream::operator>>((istream *)in,&p->_x);
  std::istream::operator>>(this,&local_18->_y);
  uVar1 = std::ios::operator!((ios *)((long)&p_local->_x + *(long *)((long)*p_local + -0x18)));
  if ((uVar1 & 1) != 0) {
    Point::Point(&local_20,0.0,0.0);
    *local_18 = local_20;
  }
  return (istream *)p_local;
}

Assistant:

istream& operator>>(istream& in, Point& p)
{
    in >> p._x >> p._y;
    if (!in) {
        p = Point();  // input failed, reset object to default state
    }
    return in;
}